

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Bus_ManReadInOutLoads(Bus_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long *plVar4;
  long lVar5;
  SC_Lib *p_00;
  SC_Cell *pSVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  char *__file;
  float fVar11;
  
  fVar11 = Abc_FrameReadMaxLoad();
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    fVar11 = Abc_FrameReadMaxLoad();
    pVVar2 = p->pNtk->vCos;
    lVar8 = (long)pVVar2->nSize;
    if (0 < lVar8) {
      ppvVar3 = pVVar2->pArray;
      lVar10 = 0;
      do {
        plVar4 = (long *)ppvVar3[lVar10];
        iVar1 = (int)plVar4[2];
        if (((long)iVar1 < 0) ||
           (lVar5 = *(long *)(*(long *)(*plVar4 + 0x168) + 0x38), *(int *)(lVar5 + 4) <= iVar1)) {
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
          ;
          pcVar9 = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
          goto LAB_003de75e;
        }
        *(float *)(*(long *)(lVar5 + 8) + (long)iVar1 * 4) = fVar11;
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
  }
  pcVar9 = Abc_FrameReadDrivingCell();
  if (pcVar9 != (char *)0x0) {
    p_00 = p->pLib;
    pcVar9 = Abc_FrameReadDrivingCell();
    uVar7 = Abc_SclCellFind(p_00,pcVar9);
    if (uVar7 == 0xffffffff) {
      pcVar9 = Abc_FrameReadDrivingCell();
      printf("Cannot find the default PI driving cell (%s) in the library.\n",pcVar9);
      return;
    }
    if (((int)uVar7 < 0) || ((p->pLib->vCells).nSize <= (int)uVar7)) {
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
      ;
      pcVar9 = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_003de75e:
      __assert_fail("i >= 0 && i < p->nSize",__file,0x184,pcVar9);
    }
    pSVar6 = (SC_Cell *)(p->pLib->vCells).pArray[uVar7];
    p->pPiDrive = pSVar6;
    if (pSVar6 == (SC_Cell *)0x0) {
      __assert_fail("p->pPiDrive != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                    ,0x98,"void Bus_ManReadInOutLoads(Bus_Man_t *)");
    }
    if (pSVar6->n_inputs != 1) {
      __assert_fail("p->pPiDrive->n_inputs == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                    ,0x99,"void Bus_ManReadInOutLoads(Bus_Man_t *)");
    }
  }
  return;
}

Assistant:

void Bus_ManReadInOutLoads( Bus_Man_t * p )
{
    if ( Abc_FrameReadMaxLoad() )
    {
        Abc_Obj_t * pObj; int i;
        float MaxLoad = Abc_FrameReadMaxLoad();
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            Bus_SclObjSetCin( pObj, MaxLoad );
//        printf( "Default output load is specified (%f ff).\n", MaxLoad );
    }
    if ( Abc_FrameReadDrivingCell() )
    {
        int iCell = Abc_SclCellFind( p->pLib, Abc_FrameReadDrivingCell() );
        if ( iCell == -1 )
            printf( "Cannot find the default PI driving cell (%s) in the library.\n", Abc_FrameReadDrivingCell() );
        else
        {
//            printf( "Default PI driving cell is specified (%s).\n", Abc_FrameReadDrivingCell() );
            p->pPiDrive = SC_LibCell( p->pLib, iCell );
            assert( p->pPiDrive != NULL );
            assert( p->pPiDrive->n_inputs == 1 );
//            printf( "Default input driving cell is specified (%s).\n", p->pPiDrive->pName );
        }
    }
}